

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerResults.cpp
# Opt level: O3

void __thiscall
SimpleParallelAnalyzerResults::GenerateExportFile
          (SimpleParallelAnalyzerResults *this,char *file,DisplayBase display_base,
          U32 export_type_user_id)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  void *pvVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  Frame frame;
  stringstream ss;
  char number_str [128];
  char time_str [128];
  uchar *local_338;
  uchar local_328 [16];
  ulonglong local_318;
  ulong local_310;
  undefined1 *local_308;
  uint local_300;
  undefined1 local_2f8 [16];
  ulonglong local_2e8 [2];
  ulonglong local_2d8;
  stringstream local_2c0 [16];
  long local_2b0;
  string local_2a8 [104];
  ios_base local_240 [264];
  char local_138 [128];
  char local_b8 [136];
  
  std::__cxx11::stringstream::stringstream(local_2c0);
  pvVar4 = (void *)AnalyzerHelpers::StartFile(file,false);
  local_318 = Analyzer::GetTriggerSample();
  uVar3 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"Time [s],Value",0xe);
  std::ios::widen((char)*(undefined8 *)(local_2b0 + -0x18) + (char)&local_2b0);
  std::ostream::put((char)&local_2b0);
  std::ostream::flush();
  uVar5 = AnalyzerResults::GetNumFrames();
  if (uVar5 != 0) {
    uVar7 = 0;
    uVar8 = 1;
    do {
      local_310 = uVar7;
      AnalyzerResults::GetFrame((ulonglong)local_2e8);
      AnalyzerHelpers::GetTimeString(local_2e8[0],local_318,uVar3,local_b8,0x80);
      AnalyzerHelpers::GetNumberString(local_2d8,display_base,0x10,local_138,0x80);
      sVar6 = strlen(local_b8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,local_b8,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,",",1);
      sVar6 = strlen(local_138);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,local_138,sVar6);
      std::ios::widen((char)*(undefined8 *)(local_2b0 + -0x18) + (char)&local_2b0);
      std::ostream::put((char)&local_2b0);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      AnalyzerHelpers::AppendToFile(local_338,local_300,pvVar4);
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338 != local_328) {
        operator_delete(local_338);
      }
      local_328[0] = '\0';
      std::__cxx11::stringbuf::str(local_2a8);
      cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,local_310);
      if (cVar2 != '\0') {
        AnalyzerHelpers::EndFile(pvVar4);
        Frame::~Frame((Frame *)local_2e8);
        goto LAB_00106e6e;
      }
      Frame::~Frame((Frame *)local_2e8);
      bVar1 = uVar8 < uVar5;
      uVar7 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
      local_338 = local_328;
    } while (bVar1);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar5);
  AnalyzerHelpers::EndFile(pvVar4);
LAB_00106e6e:
  std::__cxx11::stringstream::~stringstream(local_2c0);
  std::ios_base::~ios_base(local_240);
  return;
}

Assistant:

void SimpleParallelAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
    std::stringstream ss;
    void* f = AnalyzerHelpers::StartFile( file );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    ss << "Time [s],Value" << std::endl;

    U64 num_frames = GetNumFrames();
    for( U32 i = 0; i < num_frames; i++ )
    {
        Frame frame = GetFrame( i );

        char time_str[ 128 ];
        AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 16, number_str, 128 );

        ss << time_str << "," << number_str << std::endl;

        AnalyzerHelpers::AppendToFile( ( U8* )ss.str().c_str(), ss.str().length(), f );
        ss.str( std::string() );

        if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
        {
            AnalyzerHelpers::EndFile( f );
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
    AnalyzerHelpers::EndFile( f );
}